

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EncodingCXX.cxx
# Opt level: O0

string * adios2sys::Encoding::ToNarrow_abi_cxx11_(wchar_t *wcstr)

{
  size_t sVar1;
  char *dest;
  reference pvVar2;
  string *in_RDI;
  vector<char,_std::allocator<char>_> chars;
  size_t length;
  string *str;
  size_t in_stack_ffffffffffffff78;
  wchar_t *in_stack_ffffffffffffff80;
  char *in_stack_ffffffffffffff88;
  allocator_type *__a;
  string *this;
  allocator_type local_49;
  vector<char,_std::allocator<char>_> local_48;
  char *local_20;
  undefined1 local_11;
  
  local_11 = 0;
  this = in_RDI;
  std::__cxx11::string::string((string *)in_RDI);
  sVar1 = adios2sysEncoding_wcstombs
                    (in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  dest = (char *)(sVar1 + 1);
  if (dest != (char *)0x0) {
    __a = &local_49;
    local_20 = dest;
    std::allocator<char>::allocator();
    std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)this,(size_type)in_RDI,__a);
    std::allocator<char>::~allocator(&local_49);
    std::vector<char,_std::allocator<char>_>::operator[](&local_48,0);
    sVar1 = adios2sysEncoding_wcstombs(dest,in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    if (sVar1 != 0) {
      pvVar2 = std::vector<char,_std::allocator<char>_>::operator[](&local_48,0);
      std::__cxx11::string::operator=((string *)in_RDI,pvVar2);
    }
    std::vector<char,_std::allocator<char>_>::~vector((vector<char,_std::allocator<char>_> *)__a);
  }
  return this;
}

Assistant:

std::string Encoding::ToNarrow(const wchar_t* wcstr)
{
  std::string str;
  size_t length = kwsysEncoding_wcstombs(nullptr, wcstr, 0) + 1;
  if (length > 0) {
    std::vector<char> chars(length);
    if (kwsysEncoding_wcstombs(&chars[0], wcstr, length) > 0) {
      str = &chars[0];
    }
  }
  return str;
}